

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

ly_set * lys_xpath_atomize(lys_node *cur_snode,lyxp_node_type cur_snode_type,char *expr,int options)

{
  int iVar1;
  ly_set *set_00;
  lys_module *module;
  long lVar2;
  uint options_00;
  ulong uVar3;
  undefined1 auStack_58 [8];
  lyxp_set set;
  
  if (expr == (char *)0x0 || cur_snode == (lys_node *)0x0) {
LAB_0015aa7e:
    set_00 = (ly_set *)0x0;
  }
  else {
    if (cur_snode_type < LYXP_NODE_ELEM) {
      do {
        if (cur_snode == (lys_node *)0x0) {
          module = (lys_module *)0x0;
        }
        else {
          module = cur_snode->module;
          if ((module->field_0x40 & 1) != 0) {
            module = (lys_module *)module->data;
          }
        }
        cur_snode = lys_getnext((lys_node *)0x0,(lys_node *)0x0,module,0);
      } while ((cur_snode_type == LYXP_NODE_ROOT_CONFIG) && ((cur_snode->flags & 2) != 0));
    }
    set.val._8_8_ = 0;
    set.used = 0;
    set.size = 0;
    set._8_8_ = 0;
    set.val.nodes = (lyxp_set_nodes *)0x0;
    auStack_58 = (undefined1  [8])0x0;
    set.type = LYXP_SET_EMPTY;
    set._4_4_ = 0;
    if ((options & 1U) == 0) {
      if ((options & 2U) == 0) {
        options_00 = options | 4;
      }
      else {
        options_00 = options & 0xffffffecU | 0x10;
      }
    }
    else {
      options_00 = options & 0xfffffff6U | 8;
    }
    iVar1 = lyxp_atomize(expr,cur_snode,cur_snode_type,(lyxp_set *)auStack_58,options_00);
    if (iVar1 == 0) {
      set_00 = ly_set_new();
      if (set.val._8_4_ != 0) {
        lVar2 = 8;
        uVar3 = 0;
        do {
          if (*(int *)(set._8_8_ + lVar2) == 2) {
            iVar1 = ly_set_add(set_00,*(void **)(set._8_8_ + -8 + lVar2),1);
            if (iVar1 == -1) {
              ly_set_free(set_00);
              free((void *)set._8_8_);
              goto LAB_0015aa7e;
            }
          }
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 0x10;
        } while (uVar3 < (set.val._8_8_ & 0xffffffff));
      }
      free((void *)set._8_8_);
    }
    else {
      free((void *)set._8_8_);
      set_00 = (ly_set *)0x0;
      ly_vlog(LYE_SPEC,LY_VLOG_LYS,cur_snode,"Resolving XPath expression \"%s\" failed.",expr);
    }
  }
  return set_00;
}

Assistant:

ly_set *
lys_xpath_atomize(const struct lys_node *cur_snode, enum lyxp_node_type cur_snode_type, const char *expr, int options)
{
    struct lyxp_set set;
    struct ly_set *ret_set;
    uint32_t i;

    if (!cur_snode || !expr) {
        return NULL;
    }

    /* adjust the root */
    if ((cur_snode_type == LYXP_NODE_ROOT) || (cur_snode_type == LYXP_NODE_ROOT_CONFIG)) {
        do {
            cur_snode = lys_getnext(NULL, NULL, lys_node_module(cur_snode), 0);
        } while ((cur_snode_type == LYXP_NODE_ROOT_CONFIG) && (cur_snode->flags & LYS_CONFIG_R));
    }

    memset(&set, 0, sizeof set);

    if (options & LYXP_MUST) {
        options &= ~LYXP_MUST;
        options |= LYXP_SNODE_MUST;
    } else if (options & LYXP_WHEN) {
        options &= ~LYXP_WHEN;
        options |= LYXP_SNODE_WHEN;
    } else {
        options |= LYXP_SNODE;
    }

    if (lyxp_atomize(expr, cur_snode, cur_snode_type, &set, options)) {
        free(set.val.snodes);
        LOGVAL(LYE_SPEC, LY_VLOG_LYS, cur_snode, "Resolving XPath expression \"%s\" failed.", expr);
        return NULL;
    }

    ret_set = ly_set_new();

    for (i = 0; i < set.used; ++i) {
        switch (set.val.snodes[i].type) {
        case LYXP_NODE_ELEM:
            if (ly_set_add(ret_set, set.val.snodes[i].snode, LY_SET_OPT_USEASLIST) == -1) {
                ly_set_free(ret_set);
                free(set.val.snodes);
                return NULL;
            }
            break;
        default:
            /* ignore roots, text and attr should not ever appear */
            break;
        }
    }

    free(set.val.snodes);
    return ret_set;
}